

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

string * __thiscall
libcellml::Component::math_abi_cxx11_(string *__return_storage_ptr__,Component *this)

{
  ComponentImpl *pCVar1;
  Component *this_local;
  
  pCVar1 = pFunc(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pCVar1->mMath);
  return __return_storage_ptr__;
}

Assistant:

std::string Component::math() const
{
    return pFunc()->mMath;
}